

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters *params)

{
  string local_188;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_168;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_128;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_c8;
  Resources res;
  
  Environment::Environment(&env,(Context *)this,4);
  DescriptorSet::Resources::Resources(&res,&env,(Parameters *)context);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_168,&env,&res,params);
  local_188.field_2._M_allocated_capacity = (size_type)local_168.m_data.deleter.m_device;
  local_188.field_2._8_8_ = local_168.m_data.deleter.m_pool.m_internal;
  local_188._M_dataplus._M_p = (pointer)local_168.m_data.object.m_internal;
  local_188._M_string_length = (size_type)local_168.m_data.deleter.m_deviceIface;
  local_168.m_data.object.m_internal = 0;
  local_168.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_168.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_168);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_148,&env,&res,params);
  local_168.m_data.deleter.m_device = local_148.m_data.deleter.m_device;
  local_168.m_data.deleter.m_pool.m_internal = local_148.m_data.deleter.m_pool.m_internal;
  local_168.m_data.object.m_internal = local_148.m_data.object.m_internal;
  local_168.m_data.deleter.m_deviceIface = local_148.m_data.deleter.m_deviceIface;
  local_148.m_data.object.m_internal = 0;
  local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_148.m_data.deleter.m_device = (VkDevice)0x0;
  local_148.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_148);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_128,&env,&res,params);
  local_148.m_data.deleter.m_device = local_128.m_data.deleter.m_device;
  local_148.m_data.deleter.m_pool.m_internal = local_128.m_data.deleter.m_pool.m_internal;
  local_148.m_data.object.m_internal = local_128.m_data.object.m_internal;
  local_148.m_data.deleter.m_deviceIface = local_128.m_data.deleter.m_deviceIface;
  local_128.m_data.object.m_internal = 0;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_128.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_128);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_c8,&env,&res,params);
  local_128.m_data.deleter.m_device = local_c8.m_data.deleter.m_device;
  local_128.m_data.deleter.m_pool.m_internal = local_c8.m_data.deleter.m_pool.m_internal;
  local_128.m_data.object.m_internal = local_c8.m_data.object.m_internal;
  local_128.m_data.deleter.m_deviceIface = local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_148);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_168);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"Ok",(allocator<char> *)&local_168);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  DescriptorSet::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}